

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

int FindCollisions<Blob<224>>
              (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,
              HashSet<Blob<224>_> *collisions,int maxCollisions)

{
  pointer pBVar1;
  long lVar2;
  pointer pBVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  pointer pBVar7;
  ulong uVar8;
  
  pBVar3 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar7 = pBVar3;
  if (pBVar3 != pBVar1) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pBVar3,pBVar1,
               (int)LZCOUNT(((long)pBVar1 - (long)pBVar3 >> 2) * 0x6db6db6db6db6db7) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pBVar3,pBVar1);
    pBVar3 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar7 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  iVar6 = 0;
  if (1 < (ulong)(((long)pBVar3 - (long)pBVar7 >> 2) * 0x6db6db6db6db6db7)) {
    uVar8 = 1;
    lVar5 = 0x1d;
    iVar6 = 0;
    do {
      if (pBVar7[uVar8].bytes[0] == pBVar7[uVar8 - 1].bytes[0]) {
        lVar2 = -0x1b;
        do {
          lVar4 = lVar2;
          if (lVar4 == 0) goto LAB_0014e4ac;
          lVar2 = lVar4 + 1;
        } while (pBVar7->bytes[lVar4 + lVar5 + 0x1b] == pBVar7->bytes[lVar4 + lVar5 + -1]);
        if (0x1a < lVar4 + 0x1bU) {
LAB_0014e4ac:
          iVar6 = iVar6 + 1;
          if ((int)(collisions->
                   super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>)._M_t.
                   _M_impl.super__Rb_tree_header._M_node_count < maxCollisions) {
            std::
            _Rb_tree<Blob<224>,Blob<224>,std::_Identity<Blob<224>>,std::less<Blob<224>>,std::allocator<Blob<224>>>
            ::_M_insert_unique<Blob<224>const&>
                      ((_Rb_tree<Blob<224>,Blob<224>,std::_Identity<Blob<224>>,std::less<Blob<224>>,std::allocator<Blob<224>>>
                        *)collisions,pBVar7 + uVar8);
            pBVar7 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pBVar3 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          }
        }
      }
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 0x1c;
    } while (uVar8 < (ulong)(((long)pBVar3 - (long)pBVar7 >> 2) * 0x6db6db6db6db6db7));
  }
  return iVar6;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}